

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_tags.cpp
# Opt level: O3

int __thiscall FSectorTagIterator::Next(FSectorTagIterator *this)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  FTagItem *pFVar4;
  uint uVar5;
  
  pFVar4 = tagManager.allTags.Array;
  iVar2 = numsectors;
  if (this->searchtag == 0) {
    uVar1 = this->start;
    uVar5 = uVar1;
    if ((int)uVar1 < numsectors) {
      piVar3 = tagManager.startForSector.Array + uVar1;
      while (((-1 < (int)uVar1 && ((int)uVar5 < (int)tagManager.startForSector.Count)) &&
             (-1 < *piVar3))) {
        uVar5 = uVar5 + 1;
        this->start = uVar5;
        piVar3 = piVar3 + 1;
        if (iVar2 <= (int)uVar5) {
          return -1;
        }
      }
    }
    if (uVar5 == iVar2) {
      return -1;
    }
    iVar2 = uVar5 + 1;
  }
  else {
    uVar1 = this->start;
    while (-1 < (int)uVar1) {
      if (pFVar4[uVar1].tag == this->searchtag) goto LAB_00457d70;
      uVar1 = pFVar4[uVar1].nexttag;
      this->start = uVar1;
    }
    pFVar4 = tagManager.allTags.Array;
    if (uVar1 == 0xffffffff) {
      return -1;
    }
LAB_00457d70:
    uVar5 = pFVar4[(int)uVar1].target;
    iVar2 = pFVar4[(int)uVar1].nexttag;
  }
  this->start = iVar2;
  return uVar5;
}

Assistant:

int FSectorTagIterator::Next()
{
	int ret;
	if (searchtag == INT_MIN)
	{
		ret = start;
		start = -1;
	}
	else if (searchtag != 0)
	{
		while (start >= 0 && tagManager.allTags[start].tag != searchtag) start = tagManager.allTags[start].nexttag;
		if (start == -1) return -1;
		ret = tagManager.allTags[start].target;
		start = tagManager.allTags[start].nexttag;
	}
	else
	{
		// with the tag manager, searching for tag 0 has to be different, because it won't create entries for untagged sectors.
		while (start < numsectors && tagManager.SectorHasTags(start))
		{
			start++;
		}
		if (start == numsectors) return -1;
		ret = start;
		start++;
	}
	return ret;
}